

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

QSize __thiscall QDockWidgetGroupWindowItem::maximumSize(QDockWidgetGroupWindowItem *this)

{
  long lVar1;
  QWidget *this_00;
  QDockWidget *pQVar2;
  QSize QVar3;
  QLayout *pQVar4;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QDockWidget *dw;
  FindChildOption in_stack_ffffffffffffffbc;
  QFlags<Qt::FindChildOption> *in_stack_ffffffffffffffc0;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)(**(code **)(*(long *)in_RDI + 0x68))();
  QFlags<Qt::FindChildOption>::QFlags(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pQVar2 = QObject::findChild<QDockWidget*>(in_RDI,(FindChildOptions)in_stack_ffffffffffffffec.i);
  if (pQVar2 == (QDockWidget *)0x0) {
    pQVar4 = lay((QDockWidgetGroupWindowItem *)0x580005);
    QVar3 = (QSize)(**(code **)(*(long *)pQVar4 + 0x98))();
  }
  else {
    QVar3 = QWidget::maximumSize(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize maximumSize() const override
    {
        auto dw = widget()->findChild<QDockWidget *>();
        if (dw)
            return dw->maximumSize();
        return lay()->maximumSize();
    }